

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Decompose_LDLt
          (TPZSkylMatrix<std::complex<float>_> *this,list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  undefined8 uVar2;
  char cVar3;
  complex<float> **ppcVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar7;
  long lVar8;
  _List_node_base *p_Var9;
  long lVar10;
  long lVar11;
  complex<float> *pcVar12;
  complex<float> *pcVar13;
  long lVar14;
  long lVar15;
  _List_node_base *p_Var16;
  _List_node_base *p_Var17;
  long lVar18;
  long lVar19;
  float fVar20;
  float __z;
  undefined8 uVar21;
  undefined8 uVar22;
  _ComplexT _Var23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  
  cVar3 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed;
  if (cVar3 != '\0') {
    if (cVar3 == '\x04') {
      return 1;
    }
    TPZMatrix<std::complex<float>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<float>>::Decompose_LDLt(std::list<int64_t> &) [TVar = std::complex<float>]"
               ,"Decompose_LDLt <Matrix already Decomposed with different decomposition>");
  }
  std::__cxx11::list<long,_std::allocator<long>_>::clear(singular);
  iVar6 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  if (1 < CONCAT44(extraout_var,iVar6)) {
    lVar14 = 1;
    local_80 = 2;
    local_88 = 3;
    local_78 = 8;
    local_90 = 0x10;
    do {
      ppcVar4 = (this->fElem).fStore;
      lVar7 = (long)ppcVar4[lVar14 + 1] - (long)ppcVar4[lVar14] >> 3;
      if (0 < lVar7) {
        p_Var17 = (_List_node_base *)((lVar14 - lVar7) + 1);
        lVar10 = local_80 - lVar7;
        lVar18 = local_88 - lVar7;
        lVar7 = local_90 + lVar7 * -8;
        p_Var9 = p_Var17;
        do {
          ppcVar4 = (this->fElem).fStore;
          pcVar13 = ppcVar4[(long)p_Var9];
          lVar8 = (long)ppcVar4[(long)((long)&p_Var9->_M_next + 1)] - (long)pcVar13 >> 3;
          p_Var16 = (_List_node_base *)((long)p_Var9 + (1 - lVar8));
          if ((long)p_Var16 < (long)p_Var17) {
            p_Var16 = p_Var17;
          }
          if ((long)p_Var16 < (long)p_Var9) {
            lVar11 = (long)&ppcVar4[lVar14]->_M_value + local_78;
            lVar8 = lVar18 - lVar8;
            lVar19 = lVar8;
            if (lVar8 < lVar10) {
              lVar19 = lVar10;
            }
            lVar15 = (long)&pcVar13->_M_value + lVar7;
            fVar27 = 0.0;
            fVar28 = 0.0;
            do {
              uVar22 = *(undefined8 *)(lVar11 + lVar19 * -8);
              uVar2 = *(undefined8 *)(lVar15 + lVar19 * -8);
              fVar25 = (float)((ulong)uVar2 >> 0x20);
              fVar26 = (float)((ulong)uVar22 >> 0x20);
              fVar20 = (float)uVar2 * (float)uVar22 - fVar25 * fVar26;
              uVar21 = CONCAT44(fVar25 * fVar26,fVar20);
              fVar24 = (float)uVar22 * fVar25 + fVar26 * (float)uVar2;
              if ((NAN(fVar20)) && (NAN(fVar24))) {
                uVar21 = __mulsc3(uVar22,CONCAT44(fVar26,fVar26),uVar2,fVar25);
                fVar24 = (float)((ulong)uVar21 >> 0x20);
              }
              _Var23 = (this->fElem).fStore[(long)p_Var16]->_M_value;
              fVar25 = (float)_Var23;
              fVar26 = (float)(_Var23 >> 0x20);
              fVar20 = (float)uVar21 * fVar25 - fVar26 * fVar24;
              fVar24 = fVar25 * fVar24 + (float)uVar21 * fVar26;
              if ((NAN(fVar20)) && (NAN(fVar24))) {
                uVar22 = __mulsc3();
                fVar20 = (float)uVar22;
                fVar24 = (float)((ulong)uVar22 >> 0x20);
              }
              fVar27 = fVar27 + fVar20;
              fVar28 = fVar28 + fVar24;
              p_Var16 = (_List_node_base *)((long)&p_Var16->_M_next + 1);
              lVar11 = lVar11 + -8;
              lVar15 = lVar15 + -8;
            } while ((long)p_Var16 < (long)p_Var9);
            if (lVar8 < lVar10) {
              lVar8 = lVar10;
            }
            pcVar12 = (complex<float> *)(lVar11 + lVar8 * -8);
          }
          else {
            pcVar12 = ppcVar4[lVar14] + (lVar14 - (long)p_Var16);
            pcVar13 = pcVar13 + ((long)p_Var9 - (long)p_Var16);
            fVar27 = 0.0;
            fVar28 = 0.0;
          }
          fVar28 = (float)(pcVar12->_M_value >> 0x20) - fVar28;
          _Var23 = CONCAT44(fVar28,(float)pcVar12->_M_value - fVar27);
          pcVar12->_M_value = _Var23;
          if (pcVar13 == pcVar12) {
            fVar28 = cabsf((float)pcVar12->_M_value);
            if (ABS(fVar28) < 1e-07) {
              p_Var16 = (_List_node_base *)operator_new(0x18);
              p_Var16[1]._M_next = p_Var9;
              std::__detail::_List_node_base::_M_hook(p_Var16);
              psVar1 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node.
                        _M_size;
              *psVar1 = *psVar1 + 1;
              _Var23 = 0x3f800000;
              goto LAB_00cbdd34;
            }
          }
          else {
            _Var23 = __divsc3(_Var23,CONCAT44(fVar28,fVar28),(int)pcVar13->_M_value,
                              *(undefined4 *)((long)&pcVar13->_M_value + 4));
LAB_00cbdd34:
            pcVar12->_M_value = _Var23;
          }
          lVar18 = lVar18 + 1;
          lVar7 = lVar7 + 8;
          bVar5 = (long)p_Var9 < lVar14;
          p_Var9 = (_List_node_base *)((long)&p_Var9->_M_next + 1);
        } while (bVar5);
      }
      lVar14 = lVar14 + 1;
      local_80 = local_80 + 1;
      local_88 = local_88 + 1;
      local_78 = local_78 + 8;
      local_90 = local_90 + 8;
    } while (lVar14 != CONCAT44(extraout_var,iVar6));
  }
  lVar14 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  if (lVar14 != 0) {
    (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x24])(this,lVar14 + -1);
    fVar28 = cabsf(__z);
    if (ABS(fVar28) < 1e-07) {
      lVar14 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = (_List_node_base *)(lVar14 + -1);
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x23])
                (this,(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow + -1);
    }
  }
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\x04';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_LDLt(std::list<int64_t> &singular)
{
    if( this->fDecomposed == ELDLt) return 1;
    if ( this->fDecomposed )
    {
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_LDLt <Matrix already Decomposed with different decomposition>" );
    }
    
#ifdef DUMP_BEFORE_DECOMPOSE
    dump_matrix(this, "TPZSkylMatrix::Decompose_LDLt(singular)");
#endif
    
    singular.clear();
    
    // Third try
    TVar *elj,*ell;
    int64_t j,l,minj,minl,minrow,dimension = this->Dim();
    TVar sum;
    j = 1;
    while(j < dimension) {
        minj = j-Size(j)+1;
        l = minj;
        while(l <= j) {
            minl = l-Size(l)+1;
            minrow = (minj<minl)? minl:minj;
            int64_t k = minrow;
            //			DiagkPtr = fDiag+minrow;
            elj = fElem[j]+j-minrow;
            ell = fElem[l]+l-minrow;
            sum = 0.;
            //EBORIN: 
            // Is this a hot spot?
            while(k < l) {
                sum += *elj-- * *ell-- * *(fElem[k++]);
            }
            *elj -= sum;
            if(ell != elj) *elj /= *ell;
            else if(IsZero(*elj)) {
                singular.push_back(l);
                *elj = 1.;
            }
            l++;
        }
        j++;
    }
    
    if(this->Rows() && IsZero(GetVal(this->Rows()-1,this->Rows()-1)))
    {
        singular.push_back(this->Rows()-1);
        PutVal(this->Rows()-1,this->Rows()-1,1.);
    }
    this->fDecomposed  = ELDLt;
    this->fDefPositive = 0;
    //if(Dim() > 100) cout << endl;
    return( 1 );
}